

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O0

Instruction * __thiscall
spvtools::val::ValidationState_t::TracePointer(ValidationState_t *this,Instruction *inst)

{
  Op OVar1;
  uint id;
  bool bVar2;
  undefined8 local_20;
  Instruction *base_ptr;
  Instruction *inst_local;
  ValidationState_t *this_local;
  
  local_20 = inst;
  while( true ) {
    OVar1 = val::Instruction::opcode(local_20);
    bVar2 = true;
    if (OVar1 != OpAccessChain) {
      OVar1 = val::Instruction::opcode(local_20);
      bVar2 = true;
      if (OVar1 != OpInBoundsAccessChain) {
        OVar1 = val::Instruction::opcode(local_20);
        bVar2 = true;
        if (OVar1 != OpPtrAccessChain) {
          OVar1 = val::Instruction::opcode(local_20);
          bVar2 = true;
          if (OVar1 != OpInBoundsPtrAccessChain) {
            OVar1 = val::Instruction::opcode(local_20);
            bVar2 = OVar1 == OpCopyObject;
          }
        }
      }
    }
    if (!bVar2) break;
    id = val::Instruction::GetOperandAs<unsigned_int>(local_20,2);
    local_20 = FindDef(this,id);
  }
  return local_20;
}

Assistant:

const Instruction* ValidationState_t::TracePointer(
    const Instruction* inst) const {
  auto base_ptr = inst;
  while (base_ptr->opcode() == spv::Op::OpAccessChain ||
         base_ptr->opcode() == spv::Op::OpInBoundsAccessChain ||
         base_ptr->opcode() == spv::Op::OpPtrAccessChain ||
         base_ptr->opcode() == spv::Op::OpInBoundsPtrAccessChain ||
         base_ptr->opcode() == spv::Op::OpCopyObject) {
    base_ptr = FindDef(base_ptr->GetOperandAs<uint32_t>(2u));
  }
  return base_ptr;
}